

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::ExitLoop(ByteCodeWriter *this,uint loopId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  FunctionBody *functionBody;
  undefined4 *puVar4;
  Type *pTVar5;
  uint loopId_local;
  ByteCodeWriter *this_local;
  
  functionBody = GetFunctionWrite(this);
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
  if (bVar2) {
    Unsigned1(this,ProfiledLoopEnd,loopId);
  }
  if (this->m_loopNest < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcba,"(m_loopNest > 0)","m_loopNest > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->m_loopNest = this->m_loopNest + -1;
  uVar3 = Data::GetCurrentOffset(&this->m_byteCodeData);
  pTVar5 = JsUtil::
           List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this->m_loopHeaders,loopId);
  pTVar5->endOffset = uVar3;
  return;
}

Assistant:

void ByteCodeWriter::ExitLoop(uint loopId)
    {
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionWrite()))
        {
            this->Unsigned1(Js::OpCode::ProfiledLoopEnd, loopId);
        }
#endif
        Assert(m_loopNest > 0);
        m_loopNest--;
        m_loopHeaders->Item(loopId).endOffset = m_byteCodeData.GetCurrentOffset();
    }